

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

int32_t icu_63::SimpleTimeZone::compareToRule
                  (int8_t month,int8_t monthLen,int8_t prevMonthLen,int8_t dayOfMonth,
                  int8_t dayOfWeek,int32_t millis,int32_t millisDelta,EMode ruleMode,
                  int8_t ruleMonth,int8_t ruleDayOfWeek,int8_t ruleDay,int32_t ruleMillis)

{
  int local_1c;
  int local_18;
  int32_t ruleDayOfMonth;
  int32_t millis_local;
  int32_t iStack_c;
  int8_t dayOfWeek_local;
  int8_t dayOfMonth_local;
  int8_t prevMonthLen_local;
  int8_t monthLen_local;
  int8_t month_local;
  
  local_18 = millisDelta + millis;
  ruleDayOfMonth._3_1_ = dayOfWeek;
  millis_local._0_1_ = dayOfMonth;
  millis_local._3_1_ = month;
  while (86399999 < local_18) {
    local_18 = local_18 + -86400000;
    millis_local._0_1_ = (int8_t)millis_local + '\x01';
    ruleDayOfMonth._3_1_ = ruleDayOfMonth._3_1_ % '\a' + '\x01';
    if (monthLen < (int8_t)millis_local) {
      millis_local._0_1_ = '\x01';
      millis_local._3_1_ = millis_local._3_1_ + '\x01';
    }
  }
  while (local_18 < 0) {
    local_18 = local_18 + 86400000;
    millis_local._0_1_ = (int8_t)millis_local + -1;
    ruleDayOfMonth._3_1_ = (char)((ruleDayOfMonth._3_1_ + 5) % 7) + '\x01';
    if ((int8_t)millis_local < '\x01') {
      millis_local._3_1_ = millis_local._3_1_ + -1;
      millis_local._0_1_ = prevMonthLen;
    }
  }
  if (millis_local._3_1_ < ruleMonth) {
    iStack_c = -1;
  }
  else if (ruleMonth < millis_local._3_1_) {
    iStack_c = 1;
  }
  else {
    local_1c = 0;
    if (monthLen < ruleDay) {
      ruleDay = monthLen;
    }
    switch(ruleMode) {
    case DOM_MODE:
      local_1c = (int)ruleDay;
      break;
    case DOW_IN_MONTH_MODE:
      if (ruleDay < '\x01') {
        local_1c = ((int)monthLen + (ruleDay + 1) * 7) -
                   (((((int)ruleDayOfMonth._3_1_ + (int)monthLen) - (int)(int8_t)millis_local) + 7)
                   - (int)ruleDayOfWeek) % 7;
      }
      else {
        local_1c = (ruleDay + -1) * 7 + 1 +
                   ((ruleDayOfWeek + 7) -
                   (((int)ruleDayOfMonth._3_1_ - (int)(int8_t)millis_local) + 1)) % 7;
      }
      break;
    case DOW_GE_DOM_MODE:
      local_1c = (int)ruleDay +
                 ((((ruleDayOfWeek + 0x31) - (int)ruleDay) - (int)ruleDayOfMonth._3_1_) +
                 (int)(int8_t)millis_local) % 7;
      break;
    case DOW_LE_DOM_MODE:
      local_1c = (int)ruleDay -
                 (((0x31 - ruleDayOfWeek) + (int)ruleDay + (int)ruleDayOfMonth._3_1_) -
                 (int)(int8_t)millis_local) % 7;
    }
    if ((int8_t)millis_local < local_1c) {
      iStack_c = -1;
    }
    else if (local_1c < (int8_t)millis_local) {
      iStack_c = 1;
    }
    else if (local_18 < ruleMillis) {
      iStack_c = -1;
    }
    else if (ruleMillis < local_18) {
      iStack_c = 1;
    }
    else {
      iStack_c = 0;
    }
  }
  return iStack_c;
}

Assistant:

int32_t 
SimpleTimeZone::compareToRule(int8_t month, int8_t monthLen, int8_t prevMonthLen,
                              int8_t dayOfMonth,
                              int8_t dayOfWeek, int32_t millis, int32_t millisDelta,
                              EMode ruleMode, int8_t ruleMonth, int8_t ruleDayOfWeek,
                              int8_t ruleDay, int32_t ruleMillis)
{
    // Make adjustments for startTimeMode and endTimeMode
    millis += millisDelta;
    while (millis >= U_MILLIS_PER_DAY) {
        millis -= U_MILLIS_PER_DAY;
        ++dayOfMonth;
        dayOfWeek = (int8_t)(1 + (dayOfWeek % 7)); // dayOfWeek is one-based
        if (dayOfMonth > monthLen) {
            dayOfMonth = 1;
            /* When incrementing the month, it is desirible to overflow
             * from DECEMBER to DECEMBER+1, since we use the result to
             * compare against a real month. Wraparound of the value
             * leads to bug 4173604. */
            ++month;
        }
    }
    while (millis < 0) {
        millis += U_MILLIS_PER_DAY;
        --dayOfMonth;
        dayOfWeek = (int8_t)(1 + ((dayOfWeek+5) % 7)); // dayOfWeek is one-based
        if (dayOfMonth < 1) {
            dayOfMonth = prevMonthLen;
            --month;
        }
    }

    // first compare months.  If they're different, we don't have to worry about days
    // and times
    if (month < ruleMonth) return -1;
    else if (month > ruleMonth) return 1;

    // calculate the actual day of month for the rule
    int32_t ruleDayOfMonth = 0;

    // Adjust the ruleDay to the monthLen, for non-leap year February 29 rule days.
    if (ruleDay > monthLen) {
        ruleDay = monthLen;
    }

    switch (ruleMode)
    {
    // if the mode is day-of-month, the day of month is given
    case DOM_MODE:
        ruleDayOfMonth = ruleDay;
        break;

    // if the mode is day-of-week-in-month, calculate the day-of-month from it
    case DOW_IN_MONTH_MODE:
        // In this case ruleDay is the day-of-week-in-month (this code is using
        // the dayOfWeek and dayOfMonth parameters to figure out the day-of-week
        // of the first day of the month, so it's trusting that they're really
        // consistent with each other)
        if (ruleDay > 0)
            ruleDayOfMonth = 1 + (ruleDay - 1) * 7 +
                (7 + ruleDayOfWeek - (dayOfWeek - dayOfMonth + 1)) % 7;
        
        // if ruleDay is negative (we assume it's not zero here), we have to do
        // the same calculation figuring backward from the last day of the month.
        else
        {
            // (again, this code is trusting that dayOfWeek and dayOfMonth are
            // consistent with each other here, since we're using them to figure
            // the day of week of the first of the month)
            ruleDayOfMonth = monthLen + (ruleDay + 1) * 7 -
                (7 + (dayOfWeek + monthLen - dayOfMonth) - ruleDayOfWeek) % 7;
        }
        break;

    case DOW_GE_DOM_MODE:
        ruleDayOfMonth = ruleDay +
            (49 + ruleDayOfWeek - ruleDay - dayOfWeek + dayOfMonth) % 7;
        break;

    case DOW_LE_DOM_MODE:
        ruleDayOfMonth = ruleDay -
            (49 - ruleDayOfWeek + ruleDay + dayOfWeek - dayOfMonth) % 7;
        // Note at this point ruleDayOfMonth may be <1, although it will
        // be >=1 for well-formed rules.
        break;
    }

    // now that we have a real day-in-month for the rule, we can compare days...
    if (dayOfMonth < ruleDayOfMonth) return -1;
    else if (dayOfMonth > ruleDayOfMonth) return 1;

    // ...and if they're equal, we compare times
    if (millis < ruleMillis) return -1;
    else if (millis > ruleMillis) return 1;
    else return 0;
}